

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O1

void dumpPointerGraph(DGLLVMPointerAnalysis *pta,PTType type)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  PointerGraph *pPVar3;
  _Base_ptr p_Var4;
  undefined8 *puVar5;
  PSNode *node_00;
  pointer ppPVar6;
  pointer puVar7;
  PSNode *pPVar8;
  bool bVar9;
  long *plVar10;
  DGLLVMPointerAnalysis *pDVar11;
  long lVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  raw_ostream *this;
  _Rb_tree_node_base *p_Var15;
  undefined8 *puVar16;
  long lVar17;
  byte bVar18;
  long lVar19;
  pointer ppFVar20;
  char *pcVar21;
  ulong uVar22;
  PSNode **node;
  pointer ppPVar23;
  pointer puVar24;
  long *plVar25;
  undefined1 auVar26 [16];
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> nodes;
  PSNode *nd;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> func_nodes;
  iterator __end2;
  undefined1 local_98 [8];
  const_iterator local_90;
  _Link_type p_Stack_88;
  _Rb_tree_node_base *local_80;
  _Rb_tree_node_base *local_78;
  size_t local_70;
  DGLLVMPointerAnalysis *local_68;
  PSNode *local_60;
  long *local_58;
  long *local_50;
  long local_48;
  pointer local_40;
  PSNode *local_38;
  
  lVar12 = dg::Offset::UNKNOWN;
  if (todot[0x80] != '\x01') {
    puVar24 = (pta->PS->nodes).
              super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pta->PS->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar24 == puVar7) {
      return;
    }
    do {
      pPVar8 = (puVar24->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar8 != (PSNode *)0x0) {
        printf("NODE %3u: ");
        printName(pPVar8,false);
        if ((*(int *)(pPVar8 + 0x90) == 1) &&
           (((*(long *)(pPVar8 + 0x88) != 0 || (pPVar8[0xe9] != (PSNode)0x0)) ||
            (pPVar8[0xe8] == (PSNode)0x1)))) {
          printf(" [size: %zu, heap: %u, zeroed: %u]",*(long *)(pPVar8 + 0x88),
                 (ulong)(byte)pPVar8[0xe9]);
        }
        for (puVar16 = *(undefined8 **)(pPVar8 + 0xc0); puVar16 != (undefined8 *)0x0;
            puVar16 = (undefined8 *)*puVar16) {
          uVar22 = puVar16[2];
          if (uVar22 != 0) {
            do {
              bVar9 = 1 < uVar22;
              uVar22 = uVar22 >> 1;
            } while (bVar9);
          }
        }
        printf(" (points-to size: %zu)\n");
        local_98 = *(undefined1 (*) [8])(pPVar8 + 0xc0);
        local_90.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                 (__node_type *)0x0;
        p_Stack_88 = (_Link_type)0x0;
        if (*(long *)(pPVar8 + 200) != 0) {
          uVar22 = *(ulong *)((long)&(((__node_type *)local_98)->
                                     super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                     ._M_storage._M_storage + 8);
          if ((uVar22 & 1) == 0) {
            p_Stack_88 = (_Link_type)0x0;
            do {
              if (p_Stack_88 == (_Link_type)0x3f) {
                p_Stack_88 = (_Link_type)0x40;
                break;
              }
              bVar18 = (byte)p_Stack_88;
              p_Stack_88 = (_Link_type)((long)&(p_Stack_88->super__Rb_tree_node_base)._M_color + 1);
            } while ((uVar22 >> (bVar18 & 0x3f) & 2) == 0);
          }
          else {
            p_Stack_88 = (_Link_type)0x0;
          }
        }
        if ((p_Stack_88 != (_Link_type)0x0) || (local_98 != (undefined1  [8])0x0)) {
          do {
            lVar19 = (long)p_Stack_88 * 0x10 + __M_assign;
            lVar17 = (long)*(_Link_type *)
                            &(((_Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                *)((long)local_98 + 8))->
                             super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                             )._M_storage._M_storage * 0x10;
            node_00 = *(PSNode **)(lVar17 + -0x10 + lVar19);
            lVar17 = *(long *)(lVar17 + -8 + lVar19);
            printf("    -> ");
            printName(node_00,false);
            if (lVar17 == lVar12) {
              puts(" + Offset::UNKNOWN");
            }
            else {
              printf(" + %lu\n");
            }
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++((const_iterator *)local_98);
          } while (local_98 != (undefined1  [8])0x0 || p_Stack_88 != (_Link_type)0x0);
        }
        if (verbose[0x80] != '\0') {
          dumpPointerGraphData(pPVar8,type,false);
        }
      }
      puVar24 = puVar24 + 1;
      if (puVar24 == puVar7) {
        return;
      }
    } while( true );
  }
  puts("digraph \"Pointer State Subgraph\" {");
  local_68 = pta;
  if (callgraph[0x80] == '\x01') {
    pPVar3 = pta->PS;
    p_Var13 = (pPVar3->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(pPVar3->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var13 != p_Var1) {
      do {
        uVar2 = *(uint *)&p_Var13[1]._M_parent;
        auVar26 = llvm::Value::getName();
        lVar12 = auVar26._0_8_;
        local_98 = (undefined1  [8])&p_Stack_88;
        if (lVar12 == 0) {
          local_90.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
          _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                   (__node_type *)0x0;
          p_Stack_88 = (_Link_type)((ulong)p_Stack_88 & 0xffffffffffffff00);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,lVar12,auVar26._8_8_ + lVar12);
        }
        printf("NODEcg%u [label=\"%s\"]\n",(ulong)uVar2,local_98);
        if (local_98 != (undefined1  [8])&p_Stack_88) {
          operator_delete((void *)local_98,
                          (ulong)((long)&(p_Stack_88->super__Rb_tree_node_base)._M_color + 1));
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != p_Var1);
    }
    for (p_Var14 = (pPVar3->callGraph)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var14 != p_Var1;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      p_Var4 = p_Var14[1]._M_right;
      for (p_Var13 = p_Var14[1]._M_left; p_Var13 != p_Var4; p_Var13 = (_Base_ptr)&p_Var13->_M_parent
          ) {
        printf("NODEcg%u -> NODEcg%u\n",(ulong)*(uint *)&p_Var14[1]._M_parent,
               (ulong)**(uint **)p_Var13);
      }
    }
    if (callgraph_only[0x80] != '\0') goto LAB_00112877;
  }
  pDVar11 = local_68;
  local_40 = display_only_func.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (display_only_func.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      display_only_func.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pPVar3 = local_68->PS;
    ppPVar6 = (pPVar3->_globals).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar23 = (pPVar3->_globals).
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppPVar23 != ppPVar6;
        ppPVar23 = ppPVar23 + 1) {
      if (*ppPVar23 != (PSNode *)0x0) {
        dumpNodeToDot(*ppPVar23,type);
      }
    }
    ppPVar6 = (pPVar3->_globals).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar23 = (pPVar3->_globals).
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppPVar23 != ppPVar6;
        ppPVar23 = ppPVar23 + 1) {
      if (*ppPVar23 != (PSNode *)0x0) {
        dumpNodeEdgesToDot(*ppPVar23);
      }
    }
    pPVar3 = pDVar11->PS;
    puVar7 = (pPVar3->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar24 = (pPVar3->nodes).
                   super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar7;
        puVar24 = puVar24 + 1) {
      pPVar8 = (puVar24->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar8 != (PSNode *)0x0) {
        dumpNodeToDot(pPVar8,type);
      }
    }
    puVar7 = (pPVar3->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar24 = (pPVar3->nodes).
                   super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar7;
        puVar24 = puVar24 + 1) {
      pPVar8 = (puVar24->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if (pPVar8 != (PSNode *)0x0) {
        dumpNodeEdgesToDot(pPVar8);
      }
    }
  }
  else {
    local_80 = (_Rb_tree_node_base *)&local_90;
    local_90.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
           ((ulong)local_90.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur & 0xffffffff00000000);
    p_Stack_88 = (_Link_type)0x0;
    local_70 = 0;
    ppFVar20 = display_only_func.
               super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_78 = local_80;
    do {
      dg::pta::LLVMPointerGraphBuilder::getFunctionNodes((Function *)&local_58);
      plVar25 = local_50;
      plVar10 = local_58;
      this = (raw_ostream *)llvm::errs();
      pcVar21 = *(char **)(this + 0x20);
      if (plVar10 == plVar25) {
        if ((ulong)(*(long *)(this + 0x18) - (long)pcVar21) < 0x2b) {
          pcVar21 = "ERROR: Did not find any nodes for function ";
          goto LAB_001126b9;
        }
        builtin_strncpy(pcVar21,"ERROR: Did not find any nodes for function ",0x2b);
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 0x2b;
      }
      else {
        if ((ulong)(*(long *)(this + 0x18) - (long)pcVar21) < 6) {
          this = (raw_ostream *)llvm::raw_ostream::write((char *)this,0x11cb21);
        }
        else {
          builtin_strncpy(pcVar21,"Found ",6);
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 6;
        }
        this = (raw_ostream *)
               llvm::raw_ostream::operator<<(this,(long)local_50 - (long)local_58 >> 3);
        if ((ulong)(*(long *)(this + 0x18) - (long)*(char **)(this + 0x20)) < 0x14) {
          pcVar21 = " nodes for function ";
LAB_001126b9:
          this = (raw_ostream *)llvm::raw_ostream::write((char *)this,(ulong)pcVar21);
        }
        else {
          builtin_strncpy(*(char **)(this + 0x20)," nodes for function ",0x14);
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 0x14;
        }
      }
      pcVar21 = (char *)llvm::raw_ostream::write((char *)this,display_only_abi_cxx11_._128_8_);
      if (*(undefined1 **)(pcVar21 + 0x18) == *(undefined1 **)(pcVar21 + 0x20)) {
        llvm::raw_ostream::write(pcVar21,0x11ce01);
        plVar25 = local_58;
        plVar10 = local_50;
      }
      else {
        **(undefined1 **)(pcVar21 + 0x20) = 10;
        *(long *)(pcVar21 + 0x20) = *(long *)(pcVar21 + 0x20) + 1;
        plVar25 = local_58;
        plVar10 = local_50;
      }
      for (; plVar25 != plVar10; plVar25 = plVar25 + 1) {
        local_60 = (PSNode *)*plVar25;
        std::
        _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
        ::_M_insert_unique<dg::pta::PSNode*const&>
                  ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                    *)local_98,&local_60);
        puVar5 = *(undefined8 **)(local_60 + 0x60);
        for (puVar16 = *(undefined8 **)(local_60 + 0x58); puVar16 != puVar5; puVar16 = puVar16 + 1)
        {
          local_38 = (PSNode *)*puVar16;
          std::
          _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
          ::_M_insert_unique<dg::pta::PSNode*const&>
                    ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                      *)local_98,&local_38);
        }
      }
      if (local_58 != (long *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      ppFVar20 = ppFVar20 + 1;
    } while (ppFVar20 != local_40);
    for (p_Var14 = local_80; p_Var15 = local_80, p_Var14 != (_Rb_tree_node_base *)&local_90;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      if (*(PSNode **)(p_Var14 + 1) != (PSNode *)0x0) {
        dumpNodeToDot(*(PSNode **)(p_Var14 + 1),type);
      }
    }
    for (; p_Var14 = local_80, p_Var15 != (_Rb_tree_node_base *)&local_90;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      if (*(PSNode **)(p_Var15 + 1) != (PSNode *)0x0) {
        dumpNodeEdgesToDot(*(PSNode **)(p_Var15 + 1));
      }
    }
    for (; p_Var14 != (_Rb_tree_node_base *)&local_90;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      lVar12 = *(long *)(p_Var14 + 1);
      if (((*(uint *)(lVar12 + 0x90) & 0xfffffffe) == 8) && (*(long *)(lVar12 + 0x98) != 0)) {
        printf("\tNODE%u -> NODE%u [penwidth=2 style=dashed]\n",(ulong)*(uint *)(lVar12 + 8),
               (ulong)*(uint *)(*(long *)(lVar12 + 0x98) + 8));
      }
    }
    std::
    _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
    ::_M_erase((_Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                *)local_98,p_Stack_88);
  }
LAB_00112877:
  puts("}");
  return;
}

Assistant:

static void dumpPointerGraph(DGLLVMPointerAnalysis *pta, PTType type) {
    assert(pta);

    if (todot)
        dumpPointerGraphdot(pta, type);
    else {
        const auto &nodes = pta->getNodes();
        for (const auto &node : nodes) {
            if (node) // node id 0 is nullptr
                dumpPSNode(node.get(), type);
        }
    }
}